

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O1

void __thiscall icu_63::VTimeZone::VTimeZone(VTimeZone *this)

{
  BasicTimeZone::BasicTimeZone(&this->super_BasicTimeZone);
  (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject =
       (_func_int **)&PTR__VTimeZone_003e6260;
  this->tz = (BasicTimeZone *)0x0;
  this->vtzlines = (UVector *)0x0;
  (this->tzurl).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003f7be0;
  (this->tzurl).fUnion.fStackFields.fLengthAndFlags = 2;
  this->lastmod = 1.838821689216e+17;
  (this->olsonzid).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003f7be0;
  (this->olsonzid).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->icutzver).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003f7be0;
  (this->icutzver).fUnion.fStackFields.fLengthAndFlags = 2;
  return;
}

Assistant:

VTimeZone::VTimeZone()
:   BasicTimeZone(), tz(NULL), vtzlines(NULL),
    lastmod(MAX_MILLIS) {
}